

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O2

void __thiscall vkt::synchronization::anon_unknown_0::TestContext::~TestContext(TestContext *this)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  deUint32 ndx;
  long lVar3;
  
  pDVar1 = this->vkd;
  pVVar2 = this->device;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    (*pDVar1->_vptr_DeviceInterface[0x13])(pDVar1,pVVar2,this->fences[lVar3].m_internal,0);
  }
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->imageAllocation).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            (&(this->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase
            (&(this->pipelineCache).super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            (&(this->renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&(this->cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            (&(this->commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            (&(this->framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            (&(this->imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&(this->image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&(this->renderBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&(this->vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->vertexBufferAllocation).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->renderReadBuffer).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  return;
}

Assistant:

~TestContext()
	{
		destroyFences(vkd, device, DE_LENGTH_OF_ARRAY(fences), fences);
	}